

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void stat_update_tree(nni_stat *stat,nni_mtx **mtxp)

{
  nni_stat_item *pnVar1;
  nni_stat_info *pnVar2;
  nni_mtx *mtx;
  char *__s2;
  int iVar3;
  nni_mtx *pnVar4;
  anon_union_8_5_0a23ca40_for_si_u aVar5;
  char *pcVar6;
  nni_time nVar7;
  nni_stat *stat_00;
  
  pnVar1 = stat->s_item;
  pnVar2 = pnVar1->si_info;
  if ((pnVar2->field_0x18 & 4) == 0) {
    if (*mtxp != (nni_mtx *)0x0) {
      nni_mtx_unlock(*mtxp);
      pnVar4 = (nni_mtx *)0x0;
LAB_00112be3:
      *mtxp = pnVar4;
    }
  }
  else {
    pnVar4 = pnVar1->si_mtx;
    if (pnVar4 == (nni_mtx *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/stats.c",
                0x126,"item->si_mtx != NULL");
      pnVar4 = pnVar1->si_mtx;
    }
    mtx = *mtxp;
    if (mtx != pnVar4) {
      if (mtx != (nni_mtx *)0x0) {
        nni_mtx_unlock(mtx);
        pnVar4 = pnVar1->si_mtx;
      }
      nni_mtx_lock(pnVar4);
      pnVar4 = pnVar1->si_mtx;
      goto LAB_00112be3;
    }
  }
  switch(pnVar2->si_type) {
  case NNG_STAT_SCOPE:
  case NNG_STAT_ID:
    (stat->s_val).sv_id = (pnVar1->si_u).sv_id;
    break;
  case NNG_STAT_LEVEL:
  case NNG_STAT_COUNTER:
    if ((pnVar2->field_0x18 & 1) == 0) {
      aVar5.sv_atomic.v = *(nni_atomic_u64 *)&pnVar1->si_u;
    }
    else {
      aVar5.sv_number = nni_atomic_get64(&(pnVar1->si_u).sv_atomic);
    }
    (stat->s_val).sv_value = (uint64_t)aVar5;
    break;
  case NNG_STAT_STRING:
    nni_mtx_lock(&stats_val_lock);
    __s2 = (stat->s_val).sv_string;
    pcVar6 = (pnVar1->si_u).sv_string;
    if ((pcVar6 != (char *)0x0 & (byte)pnVar2->field_0x18 >> 1) == 1) {
      if ((__s2 == (char *)0x0) || (iVar3 = strcmp(pcVar6,__s2), iVar3 != 0)) {
        pcVar6 = nni_strdup(pcVar6);
        (stat->s_val).sv_string = pcVar6;
        nni_strfree(__s2);
      }
      else {
LAB_00112c99:
        nni_strfree(__s2);
        (stat->s_val).sv_value = 0;
      }
    }
    else {
      if ((pnVar2->field_0x18 & 2) != 0) goto LAB_00112c99;
      (stat->s_val).sv_string = pcVar6;
    }
    nni_mtx_unlock(&stats_val_lock);
    break;
  case NNG_STAT_BOOLEAN:
    (stat->s_val).sv_bool = (pnVar1->si_u).sv_bool;
  }
  nVar7 = nni_clock();
  stat->s_timestamp = nVar7;
  for (stat_00 = (nni_stat *)nni_list_first(&stat->s_children); stat_00 != (nni_stat *)0x0;
      stat_00 = (nni_stat *)nni_list_next(&stat->s_children,stat_00)) {
    stat_update_tree(stat_00,mtxp);
  }
  return;
}

Assistant:

static void
stat_update_tree(nni_stat *stat, nni_mtx **mtxp)
{
	nni_stat *child;
	stat_update(stat, mtxp);
	NNI_LIST_FOREACH (&stat->s_children, child) {
		stat_update_tree(child, mtxp);
	}
}